

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *pVVar2;
  int iVar3;
  BasicBlock *pBVar4;
  ConstantValue<long,_(flow::LiteralType)2> *arraySize;
  Value *pVVar5;
  Value *extraout_RAX;
  const_iterator cVar6;
  Value *extraout_RAX_00;
  socklen_t *__addr_len_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar7;
  string *__addr_00;
  code *pcVar8;
  long *plVar9;
  undefined1 local_35b;
  undefined1 local_35a;
  undefined1 local_359;
  BasicBlock *local_358;
  BasicBlock *local_350;
  string local_348 [24];
  
  lVar7 = CONCAT44(in_register_00000034,__fd);
  if (accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
    __addr = extraout_RDX;
    if (iVar3 != 0) {
      memcpy(local_348,&DAT_001ae1f0,0x318);
      std::
      _Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>const*>
                ((_Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,local_348,
                 &stack0xffffffffffffffd0,0,&local_359,&local_35a,&local_35b);
      __cxa_atexit(std::
                   unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                   ::~unordered_map,&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
      __addr = extraout_RDX_00;
    }
  }
  if (*(short *)(lVar7 + 0x40) == 0x29) {
    paVar1 = &local_348[0].field_2;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.left","");
    this_00 = &this->super_IRBuilder;
    pBVar4 = IRBuilder::createBlock(this_00,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.right","");
    local_350 = IRBuilder::createBlock(this_00,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.cont","");
    local_358 = IRBuilder::createBlock(this_00,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)0x1;
    arraySize = IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                          (this_00->program_,&this_00->program_->numbers_,(long *)local_348);
    local_348[0]._M_dataplus._M_p = (pointer)&local_348[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor","");
    pVVar5 = (Value *)IRBuilder::createAlloca(this_00,Boolean,(Value *)arraySize,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    (**(code **)(**(long **)(lVar7 + 0x48) + 0x10))(*(long **)(lVar7 + 0x48),this);
    pVVar2 = this->result_;
    IRBuilder::createCondBr(this_00,pVVar2,pBVar4,local_350);
    IRBuilder::setInsertPoint(this_00,pBVar4);
    paVar1 = &local_348[0].field_2;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.left","");
    IRBuilder::createStore(this_00,pVVar5,pVVar2,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    IRBuilder::createBr(this_00,local_358);
    IRBuilder::setInsertPoint(this_00,local_350);
    (**(code **)(**(long **)(lVar7 + 0x50) + 0x10))(*(long **)(lVar7 + 0x50),this);
    pVVar2 = this->result_;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"bor.right","");
    IRBuilder::createStore(this_00,pVVar5,pVVar2,local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
    }
    pBVar4 = local_358;
    IRBuilder::createBr(this_00,local_358);
    IRBuilder::setInsertPoint(this_00,pBVar4);
    this->result_ = pVVar5;
    pVVar5 = extraout_RAX;
  }
  else {
    (**(code **)(**(long **)(lVar7 + 0x48) + 0x10))(*(long **)(lVar7 + 0x48),this,__addr);
    pVVar5 = this->result_;
    (**(code **)(**(long **)(lVar7 + 0x50) + 0x10))(*(long **)(lVar7 + 0x50),this);
    pVVar2 = this->result_;
    __addr_00 = local_348;
    local_348[0]._M_dataplus._M_p._0_4_ = (uint)*(ushort *)(lVar7 + 0x40);
    cVar6 = std::
            _Hashtable<int,_std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_._M_h,(key_type *)__addr_00);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
        ._M_cur == (__node_type *)0x0) {
      iVar3 = accept(__fd + 0x40,(sockaddr *)__addr_00,__addr_len_00);
      __cxa_guard_abort(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
      _Unwind_Resume(iVar3);
    }
    pcVar8 = *(code **)((long)cVar6.
                              super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                              ._M_cur + 0x10);
    plVar9 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor +
                     *(long *)((long)cVar6.
                                     super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                                     ._M_cur + 0x18));
    if (((ulong)pcVar8 & 1) != 0) {
      pcVar8 = *(code **)(pcVar8 + *plVar9 + -1);
    }
    local_348[0]._M_dataplus._M_p = (pointer)&local_348[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"");
    pVVar5 = (Value *)(*pcVar8)(plVar9,pVVar5,pVVar2,local_348);
    this->result_ = pVVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
      operator_delete(local_348[0]._M_dataplus._M_p,local_348[0].field_2._M_allocated_capacity + 1);
      pVVar5 = extraout_RAX_00;
    }
  }
  return (int)pVVar5;
}

Assistant:

void IRGenerator::accept(BinaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, Value*, const std::string&)> ops =
      {// boolean
       {Opcode::BAND, &IRGenerator::createBAnd},
       {Opcode::BXOR, &IRGenerator::createBXor},
       // numerical
       {Opcode::NADD, &IRGenerator::createAdd},
       {Opcode::NSUB, &IRGenerator::createSub},
       {Opcode::NMUL, &IRGenerator::createMul},
       {Opcode::NDIV, &IRGenerator::createDiv},
       {Opcode::NREM, &IRGenerator::createRem},
       {Opcode::NSHL, &IRGenerator::createShl},
       {Opcode::NSHR, &IRGenerator::createShr},
       {Opcode::NPOW, &IRGenerator::createPow},
       {Opcode::NAND, &IRGenerator::createAnd},
       {Opcode::NOR, &IRGenerator::createOr},
       {Opcode::NXOR, &IRGenerator::createXor},
       {Opcode::NCMPEQ, &IRGenerator::createNCmpEQ},
       {Opcode::NCMPNE, &IRGenerator::createNCmpNE},
       {Opcode::NCMPLE, &IRGenerator::createNCmpLE},
       {Opcode::NCMPGE, &IRGenerator::createNCmpGE},
       {Opcode::NCMPLT, &IRGenerator::createNCmpLT},
       {Opcode::NCMPGT, &IRGenerator::createNCmpGT},

       // string
       {Opcode::SADD, &IRGenerator::createSAdd},
       {Opcode::SCMPEQ, &IRGenerator::createSCmpEQ},
       {Opcode::SCMPNE, &IRGenerator::createSCmpNE},
       {Opcode::SCMPLE, &IRGenerator::createSCmpLE},
       {Opcode::SCMPGE, &IRGenerator::createSCmpGE},
       {Opcode::SCMPLT, &IRGenerator::createSCmpLT},
       {Opcode::SCMPGT, &IRGenerator::createSCmpGT},
       {Opcode::SCMPBEG, &IRGenerator::createSCmpEB},
       {Opcode::SCMPEND, &IRGenerator::createSCmpEE},
       {Opcode::SCONTAINS, &IRGenerator::createSIn},

       // regex
       {Opcode::SREGMATCH, &IRGenerator::createSCmpRE},

       // ip
       {Opcode::PCMPEQ, &IRGenerator::createPCmpEQ},
       {Opcode::PCMPNE, &IRGenerator::createPCmpNE},
       {Opcode::PINCIDR, &IRGenerator::createPInCidr}, };

  if (expr.op() == Opcode::BOR) {
    // (lhs || rhs)
    //
    //   L = lhs();
    //   if (L) goto end;
    //   R = rhs();
    //   L = R;
    // end:
    //   result = L;

    BasicBlock* borLeft = createBlock("bor.left");
    BasicBlock* borRight = createBlock("bor.right");
    BasicBlock* borCont = createBlock("bor.cont");

    AllocaInstr* result = createAlloca(LiteralType::Boolean, get(1), "bor");
    Value* lhs = codegen(expr.leftExpr());
    createCondBr(lhs, borLeft, borRight);

    setInsertPoint(borLeft);
    createStore(result, lhs, "bor.left");
    createBr(borCont);

    setInsertPoint(borRight);
    Value* rhs = codegen(expr.rightExpr());
    createStore(result, rhs, "bor.right");
    createBr(borCont);

    setInsertPoint(borCont);

    result_ = result;

    return;
  }

  Value* lhs = codegen(expr.leftExpr());
  Value* rhs = codegen(expr.rightExpr());

  auto i = ops.find(expr.op());
  if (i != ops.end()) {
    result_ = (this->*i->second)(lhs, rhs, "");
  } else {
    fprintf(stderr, "BUG: Binary operation `%s` not implemented.\n",
            mnemonic(expr.op()));
    assert(!"Unimplemented");
    result_ = nullptr;
  }
}